

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int saveCursorPosition(BtCursor *pCur)

{
  int iVar1;
  uchar *pBuf;
  int iVar2;
  
  if (pCur->eState == '\x02') {
    pCur->eState = '\x01';
  }
  else {
    pCur->skipNext = 0;
  }
  sqlite3BtreeKeySize(pCur,&pCur->nKey);
  iVar2 = 0;
  if (pCur->apPage[0]->intKey == '\0') {
    pBuf = (uchar *)sqlite3Malloc(pCur->nKey);
    if (pBuf == (uchar *)0x0) {
      iVar2 = 7;
    }
    else {
      iVar2 = 0;
      iVar1 = accessPayload(pCur,0,(u32)pCur->nKey,pBuf,0);
      if (iVar1 == 0) {
        pCur->pKey = pBuf;
      }
      else {
        sqlite3_free(pBuf);
        iVar2 = iVar1;
      }
    }
  }
  if (iVar2 == 0) {
    btreeReleaseAllCursorPages(pCur);
    pCur->eState = '\x03';
  }
  pCur->curFlags = pCur->curFlags & 0xfb;
  return iVar2;
}

Assistant:

static int saveCursorPosition(BtCursor *pCur){
  int rc;

  assert( CURSOR_VALID==pCur->eState || CURSOR_SKIPNEXT==pCur->eState );
  assert( 0==pCur->pKey );
  assert( cursorHoldsMutex(pCur) );

  if( pCur->eState==CURSOR_SKIPNEXT ){
    pCur->eState = CURSOR_VALID;
  }else{
    pCur->skipNext = 0;
  }
  rc = sqlite3BtreeKeySize(pCur, &pCur->nKey);
  assert( rc==SQLITE_OK );  /* KeySize() cannot fail */

  /* If this is an intKey table, then the above call to BtreeKeySize()
  ** stores the integer key in pCur->nKey. In this case this value is
  ** all that is required. Otherwise, if pCur is not open on an intKey
  ** table, then malloc space for and store the pCur->nKey bytes of key 
  ** data.
  */
  if( 0==pCur->apPage[0]->intKey ){
    void *pKey = sqlite3Malloc( pCur->nKey );
    if( pKey ){
      rc = sqlite3BtreeKey(pCur, 0, (int)pCur->nKey, pKey);
      if( rc==SQLITE_OK ){
        pCur->pKey = pKey;
      }else{
        sqlite3_free(pKey);
      }
    }else{
      rc = SQLITE_NOMEM;
    }
  }
  assert( !pCur->apPage[0]->intKey || !pCur->pKey );

  if( rc==SQLITE_OK ){
    btreeReleaseAllCursorPages(pCur);
    pCur->eState = CURSOR_REQUIRESEEK;
  }

  invalidateOverflowCache(pCur);
  return rc;
}